

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_2c8643::Db::parseSeqId(Db *this,size_t *Out)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  byte *pbVar4;
  long lVar5;
  
  pbVar4 = (byte *)this->First;
  bVar2 = true;
  if ((((byte *)this->Last != pbVar4) && (bVar1 = *pbVar4, bVar2 = true, '/' < (char)bVar1)) &&
     ((byte)(bVar1 + 0xbf) < 0x1a || bVar1 < 0x3a)) {
    sVar3 = 0;
    while (pbVar4 != (byte *)this->Last) {
      bVar1 = *pbVar4;
      if (((long)(char)bVar1 < 0x30) ||
         ((lVar5 = -0x30, 0x39 < bVar1 && (lVar5 = -0x37, 0x19 < (byte)(bVar1 + 0xbf))))) break;
      sVar3 = sVar3 * 0x24 + lVar5 + (long)(char)bVar1;
      pbVar4 = pbVar4 + 1;
      this->First = (char *)pbVar4;
    }
    *Out = sVar3;
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

char look(unsigned Lookahead = 0) {
    if (static_cast<size_t>(Last - First) <= Lookahead)
      return '\0';
    return First[Lookahead];
  }